

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

int __thiscall
QRegularExpressionPrivate::captureIndexForName(QRegularExpressionPrivate *this,QAnyStringView name)

{
  long lVar1;
  PCRE2_SPTR16 *ppPVar2;
  bool bVar3;
  uint uVar4;
  uint i;
  uint uVar5;
  long in_FS_OFFSET;
  char16_t *local_70;
  QAnyStringView local_68;
  uint namedCapturingTableEntrySize;
  uint namedCapturingTableEntryCount;
  PCRE2_SPTR16 *namedCapturingTable;
  QAnyStringView name_local;
  
  name_local.m_size = name.m_size;
  name_local.field_0 = name.field_0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->compiledPattern == (pcre2_code_16 *)0x0) {
LAB_003a6932:
    uVar5 = 0xffffffff;
  }
  else {
    namedCapturingTable = (PCRE2_SPTR16 *)&DAT_aaaaaaaaaaaaaaaa;
    namedCapturingTableEntryCount = 0xaaaaaaaa;
    namedCapturingTableEntrySize = 0xaaaaaaaa;
    pcre2_pattern_info_16(this->compiledPattern,0x13);
    pcre2_pattern_info_16(this->compiledPattern,0x11,&namedCapturingTableEntryCount);
    pcre2_pattern_info_16(this->compiledPattern,0x12,&namedCapturingTableEntrySize);
    uVar5 = 0;
    do {
      ppPVar2 = namedCapturingTable;
      if (namedCapturingTableEntryCount <= uVar5) goto LAB_003a6932;
      uVar4 = namedCapturingTableEntrySize * uVar5;
      local_70 = (char16_t *)((ulong)uVar4 * 2 + 2 + (long)namedCapturingTable);
      QAnyStringView::QAnyStringView<const_char16_t_*,_true>(&local_68,&local_70);
      bVar3 = ::comparesEqual(&name_local,&local_68);
      uVar5 = uVar5 + 1;
    } while (!bVar3);
    uVar5 = (uint)*(ushort *)((ulong)uVar4 * 2 + (long)ppPVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

int QRegularExpressionPrivate::captureIndexForName(QAnyStringView name) const
{
    Q_ASSERT(!name.isEmpty());

    if (!compiledPattern)
        return -1;

    // See the other usages of pcre2_pattern_info_16 for more details about this
    PCRE2_SPTR16 *namedCapturingTable;
    unsigned int namedCapturingTableEntryCount;
    unsigned int namedCapturingTableEntrySize;

    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMETABLE, &namedCapturingTable);
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMECOUNT, &namedCapturingTableEntryCount);
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMEENTRYSIZE, &namedCapturingTableEntrySize);

    for (unsigned int i = 0; i < namedCapturingTableEntryCount; ++i) {
        const auto currentNamedCapturingTableRow =
                reinterpret_cast<const char16_t *>(namedCapturingTable) + namedCapturingTableEntrySize * i;

        if (name == (currentNamedCapturingTableRow + 1)) {
            const int index = *currentNamedCapturingTableRow;
            return index;
        }
    }

    return -1;
}